

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_emit_document_start(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  byte bVar1;
  yaml_version_directive_t *pyVar2;
  yaml_char_t *pyVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  yaml_char_t *pyVar9;
  byte *pbVar10;
  undefined **ppuVar11;
  yaml_tag_directive_t *pyVar12;
  yaml_tag_directive_t value;
  
  if (event->type == YAML_STREAM_END_EVENT) {
    iVar4 = yaml_emitter_flush(emitter);
    if (iVar4 != 0) {
      emitter->state = YAML_EMIT_END_STATE;
      return 1;
    }
  }
  else {
    if (event->type == YAML_DOCUMENT_START_EVENT) {
      pyVar2 = (event->data).document_start.version_directive;
      if ((pyVar2 == (yaml_version_directive_t *)0x0) ||
         (*pyVar2 == (yaml_version_directive_t)0x100000001)) {
        pyVar12 = (event->data).document_start.tag_directives.start;
        while( true ) {
          if (pyVar12 == (event->data).document_start.tag_directives.end) {
            pyVar9 = "!";
            ppuVar11 = &PTR_anon_var_dwarf_70fc_0011dd90;
            do {
              value.prefix = ppuVar11[-1];
              value.handle = pyVar9;
              iVar4 = yaml_emitter_append_tag_directive(emitter,value,1);
              if (iVar4 == 0) {
                return 0;
              }
              pyVar9 = *ppuVar11;
              ppuVar11 = ppuVar11 + 2;
            } while (pyVar9 != (yaml_char_t *)0x0);
            if ((first == 0) || (emitter->canonical != 0)) {
              iVar4 = 0;
            }
            else {
              iVar4 = (event->data).document_start.implicit;
            }
            if ((((event->data).document_start.version_directive != (yaml_version_directive_t *)0x0)
                || ((event->data).document_start.tag_directives.start !=
                    (event->data).document_start.tag_directives.end)) && (emitter->open_ended != 0))
            {
              iVar5 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
              if (iVar5 == 0) {
                return 0;
              }
              iVar5 = yaml_emitter_write_indent(emitter);
              if (iVar5 == 0) {
                return 0;
              }
            }
            if ((event->data).document_start.version_directive != (yaml_version_directive_t *)0x0) {
              iVar4 = yaml_emitter_write_indicator(emitter,"%YAML",1,0,0);
              if (iVar4 == 0) {
                return 0;
              }
              iVar4 = yaml_emitter_write_indicator(emitter,"1.1",1,0,0);
              if (iVar4 == 0) {
                return 0;
              }
              iVar5 = yaml_emitter_write_indent(emitter);
              iVar4 = 0;
              if (iVar5 == 0) {
                return 0;
              }
            }
            pyVar12 = (event->data).document_start.tag_directives.start;
            if (pyVar12 != (event->data).document_start.tag_directives.end) {
              if (pyVar12 != (event->data).document_start.tag_directives.end) {
                do {
                  iVar4 = yaml_emitter_write_indicator(emitter,"%TAG",1,0,0);
                  if (iVar4 == 0) {
                    return 0;
                  }
                  pyVar9 = pyVar12->handle;
                  sVar6 = strlen((char *)pyVar9);
                  iVar4 = yaml_emitter_write_tag_handle(emitter,pyVar9,sVar6);
                  if (iVar4 == 0) {
                    return 0;
                  }
                  pyVar9 = pyVar12->prefix;
                  sVar6 = strlen((char *)pyVar9);
                  iVar4 = yaml_emitter_write_tag_content(emitter,pyVar9,sVar6,1);
                  if (iVar4 == 0) {
                    return 0;
                  }
                  iVar4 = yaml_emitter_write_indent(emitter);
                  if (iVar4 == 0) {
                    return 0;
                  }
                  pyVar12 = pyVar12 + 1;
                } while (pyVar12 != (event->data).document_start.tag_directives.end);
              }
              iVar4 = 0;
            }
            if (iVar4 == 0) {
              iVar4 = yaml_emitter_write_indent(emitter);
              if (iVar4 == 0) {
                return 0;
              }
              iVar4 = yaml_emitter_write_indicator(emitter,"---",1,0,0);
              if (iVar4 == 0) {
                return 0;
              }
              if ((emitter->canonical != 0) &&
                 (iVar4 = yaml_emitter_write_indent(emitter), iVar4 == 0)) {
                return 0;
              }
            }
            emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;
            return 1;
          }
          pyVar9 = pyVar12->handle;
          pyVar3 = pyVar12->prefix;
          sVar6 = strlen((char *)pyVar9);
          if (sVar6 == 0) break;
          if (*pyVar9 != '!') {
            emitter->error = YAML_EMITTER_ERROR;
            pcVar7 = "tag handle must start with \'!\'";
            goto LAB_00107ed7;
          }
          if (pyVar9[sVar6 - 1] != '!') {
            emitter->error = YAML_EMITTER_ERROR;
            pcVar7 = "tag handle must end with \'!\'";
            goto LAB_00107ed7;
          }
          if (2 < (long)sVar6) {
            pbVar10 = pyVar9 + 1;
            do {
              bVar1 = *pbVar10;
              if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
                  (bVar1 != 0x2d)) && (bVar1 != 0x5f)) {
                emitter->error = YAML_EMITTER_ERROR;
                pcVar7 = "tag handle must contain alphanumerical characters only";
                goto LAB_00107ed7;
              }
              lVar8 = 1;
              if ((((char)bVar1 < '\0') && (lVar8 = 2, (bVar1 & 0xe0) != 0xc0)) &&
                 (lVar8 = 3, (bVar1 & 0xf0) != 0xe0)) {
                lVar8 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
              }
              pbVar10 = pbVar10 + lVar8;
            } while (pbVar10 < pyVar9 + (sVar6 - 1));
          }
          if (*pyVar3 == '\0') {
            emitter->error = YAML_EMITTER_ERROR;
            pcVar7 = "tag prefix must not be empty";
            goto LAB_00107ed7;
          }
          iVar4 = yaml_emitter_append_tag_directive(emitter,*pyVar12,0);
          if (iVar4 == 0) {
            return 0;
          }
          pyVar12 = pyVar12 + 1;
        }
        emitter->error = YAML_EMITTER_ERROR;
        pcVar7 = "tag handle must not be empty";
      }
      else {
        emitter->error = YAML_EMITTER_ERROR;
        pcVar7 = "incompatible %YAML directive";
      }
    }
    else {
      emitter->error = YAML_EMITTER_ERROR;
      pcVar7 = "expected DOCUMENT-START or STREAM-END";
    }
LAB_00107ed7:
    emitter->problem = pcVar7;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_emit_document_start(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (event->type == YAML_DOCUMENT_START_EVENT)
    {
        yaml_tag_directive_t default_tag_directives[] = {
            {(yaml_char_t *)"!", (yaml_char_t *)"!"},
            {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
            {NULL, NULL}
        };
        yaml_tag_directive_t *tag_directive;
        int implicit;

        if (event->data.document_start.version_directive) {
            if (!yaml_emitter_analyze_version_directive(emitter,
                        *event->data.document_start.version_directive))
                return 0;
        }

        for (tag_directive = event->data.document_start.tag_directives.start;
                tag_directive != event->data.document_start.tag_directives.end;
                tag_directive ++) {
            if (!yaml_emitter_analyze_tag_directive(emitter, *tag_directive))
                return 0;
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 0))
                return 0;
        }

        for (tag_directive = default_tag_directives;
                tag_directive->handle; tag_directive ++) {
            if (!yaml_emitter_append_tag_directive(emitter, *tag_directive, 1))
                return 0;
        }

        implicit = event->data.document_start.implicit;
        if (!first || emitter->canonical) {
            implicit = 0;
        }

        if ((event->data.document_start.version_directive ||
                    (event->data.document_start.tag_directives.start
                     != event->data.document_start.tag_directives.end)) &&
                emitter->open_ended)
        {
            if (!yaml_emitter_write_indicator(emitter, "...", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.version_directive) {
            implicit = 0;
            if (!yaml_emitter_write_indicator(emitter, "%YAML", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "1.1", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }

        if (event->data.document_start.tag_directives.start
                != event->data.document_start.tag_directives.end) {
            implicit = 0;
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive ++) {
                if (!yaml_emitter_write_indicator(emitter, "%TAG", 1, 0, 0))
                    return 0;
                if (!yaml_emitter_write_tag_handle(emitter, tag_directive->handle,
                            strlen((char *)tag_directive->handle)))
                    return 0;
                if (!yaml_emitter_write_tag_content(emitter, tag_directive->prefix,
                            strlen((char *)tag_directive->prefix), 1))
                    return 0;
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        if (yaml_emitter_check_empty_document(emitter)) {
            implicit = 0;
        }

        if (!implicit) {
            if (!yaml_emitter_write_indent(emitter))
                return 0;
            if (!yaml_emitter_write_indicator(emitter, "---", 1, 0, 0))
                return 0;
            if (emitter->canonical) {
                if (!yaml_emitter_write_indent(emitter))
                    return 0;
            }
        }

        emitter->state = YAML_EMIT_DOCUMENT_CONTENT_STATE;

        return 1;
    }

    else if (event->type == YAML_STREAM_END_EVENT)
    {

        if (!yaml_emitter_flush(emitter))
            return 0;

        emitter->state = YAML_EMIT_END_STATE;

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected DOCUMENT-START or STREAM-END");
}